

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::BIN_EXP<void(SQCompiler::*)()>
          (SQCompiler *this,SQOpcode op,offset_in_SQCompiler_to_subr f,SQInteger op3)

{
  SQInteger arg0;
  SQInteger arg1;
  SQFuncState *in_RCX;
  SQCompiler *in_RDX;
  undefined4 in_ESI;
  SQFuncState *in_RDI;
  SQInteger op2;
  SQInteger op1;
  SQCompiler *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  SQOpcode _op;
  
  Lex(in_stack_ffffffffffffff90);
  INVOKE_EXP<void(SQCompiler::*)()>(in_RDX,(offset_in_SQCompiler_to_subr)in_RCX);
  _op = (SQOpcode)((ulong)in_RDX >> 0x20);
  arg0 = SQFuncState::PopTarget(in_RDI);
  arg1 = SQFuncState::PopTarget(in_RDI);
  SQFuncState::PushTarget
            ((SQFuncState *)CONCAT44(in_ESI,in_stack_ffffffffffffff98),
             (SQInteger)(in_RDI->_vlocals)._vals);
  SQFuncState::AddInstruction
            (in_RCX,_op,arg0,arg1,(SQInteger)in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffff98));
  (in_RDI->_instructions)._allocated = 1;
  return;
}

Assistant:

void BIN_EXP(SQOpcode op, T f,SQInteger op3 = 0)
    {
        Lex();
        INVOKE_EXP(f);
        SQInteger op1 = _fs->PopTarget();SQInteger op2 = _fs->PopTarget();
        _fs->AddInstruction(op, _fs->PushTarget(), op1, op2, op3);
        _es.etype = EXPR;
    }